

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

AssertionResult * __thiscall
iutest::internal::StrCaseEqHelper::Assertion<wchar_t_const*,wchar_t_const*>
          (AssertionResult *__return_storage_ptr__,StrCaseEqHelper *this,char *expr1,char *expr2,
          wchar_t **val1,wchar_t **val2)

{
  wchar_t **actual_expression;
  char *expected_expression;
  bool bVar1;
  string local_c0;
  string local_a0;
  string local_70;
  string local_50;
  internal *local_30;
  wchar_t **val2_local;
  wchar_t **val1_local;
  char *expr2_local;
  char *expr1_local;
  
  local_30 = (internal *)val1;
  val2_local = (wchar_t **)expr2;
  val1_local = (wchar_t **)expr1;
  expr2_local = (char *)this;
  expr1_local = (char *)__return_storage_ptr__;
  bVar1 = Compare(*(wchar_t **)expr2,*val1);
  expected_expression = expr2_local;
  actual_expression = val1_local;
  if (bVar1) {
    AssertionSuccess();
  }
  else {
    FormatForComparisonFailureMessage<wchar_t_const*,wchar_t_const*>
              (&local_70,(internal *)val2_local,(wchar_t **)local_30,(wchar_t **)expr2);
    detail::ShowStringQuoted(&local_50,&local_70);
    FormatForComparisonFailureMessage<wchar_t_const*,wchar_t_const*>
              (&local_c0,local_30,val2_local,(wchar_t **)expr2);
    detail::ShowStringQuoted(&local_a0,&local_c0);
    EqFailure(__return_storage_ptr__,expected_expression,(char *)actual_expression,&local_50,
              &local_a0,true);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

inline AssertionResult IUTEST_ATTRIBUTE_UNUSED_ Assertion(
    const char* expr1, const char* expr2
        , const T1& val1, const T2& val2)
{
    if IUTEST_COND_LIKELY( Compare(val1, val2) )
    {
        return AssertionSuccess();
    }

    return EqFailure(expr1, expr2
        , detail::ShowStringQuoted(FormatForComparisonFailureMessage(val1, val2))
        , detail::ShowStringQuoted(FormatForComparisonFailureMessage(val2, val1))
        , true);
}